

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_set_rate_ratio(ma_linear_resampler *pResampler,float ratioInOut)

{
  ma_result mVar1;
  ma_uint32 sampleRateIn;
  
  if (((pResampler != (ma_linear_resampler *)0x0) && (0.0 < ratioInOut)) &&
     (sampleRateIn = (ma_uint32)(long)(ratioInOut * 1000.0), sampleRateIn != 0)) {
    mVar1 = ma_linear_resampler_set_rate(pResampler,sampleRateIn,1000);
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_linear_resampler_set_rate_ratio(ma_linear_resampler* pResampler, float ratioInOut)
{
    ma_uint32 n;
    ma_uint32 d;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (ratioInOut <= 0) {
        return MA_INVALID_ARGS;
    }

    d = 1000;
    n = (ma_uint32)(ratioInOut * d);

    if (n == 0) {
        return MA_INVALID_ARGS; /* Ratio too small. */
    }

    MA_ASSERT(n != 0);

    return ma_linear_resampler_set_rate(pResampler, n, d);
}